

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O2

string * __thiscall
duckdb::StringStats::ToString_abi_cxx11_
          (string *__return_storage_ptr__,StringStats *this,BaseStatistics *stats)

{
  StringStats *data;
  idx_t iVar1;
  idx_t iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50 [32];
  
  iVar1 = GetValidMinMaxSubstring((const_data_ptr_t)(this + 0x28));
  data = this + 0x30;
  iVar2 = GetValidMinMaxSubstring((const_data_ptr_t)data);
  ::std::__cxx11::string::string
            (local_50,"[Min: %s, Max: %s, Has Unicode: %s, Max String Length: %s]",
             (allocator *)&stack0xffffffffffffff4f);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,this + 0x28,this + iVar1 + 0x28);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,data,data + iVar2);
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1ff6dad;
  if (this[0x38] != (StringStats)0x0) {
    params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2016f9a;
  }
  if (this[0x39] == (StringStats)0x1) {
    ::std::__cxx11::to_string(&local_b0,*(uint *)(this + 0x3c));
  }
  else {
    ::std::__cxx11::string::string((string *)&local_b0,"?",(allocator *)&stack0xffffffffffffff4e);
  }
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string,char_const*,std::__cxx11::string>
            (__return_storage_ptr__,(StringUtil *)local_50,&local_70,&local_90,params_1,
             (char *)&local_b0,in_stack_ffffffffffffff48);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

string StringStats::ToString(const BaseStatistics &stats) {
	auto &string_data = StringStats::GetDataUnsafe(stats);
	idx_t min_len = GetValidMinMaxSubstring(string_data.min);
	idx_t max_len = GetValidMinMaxSubstring(string_data.max);
	return StringUtil::Format("[Min: %s, Max: %s, Has Unicode: %s, Max String Length: %s]",
	                          string(const_char_ptr_cast(string_data.min), min_len),
	                          string(const_char_ptr_cast(string_data.max), max_len),
	                          string_data.has_unicode ? "true" : "false",
	                          string_data.has_max_string_length ? to_string(string_data.max_string_length) : "?");
}